

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_private.hh
# Opt level: O0

void QPDF::Writer::optimize
               (QPDF *qpdf,ObjTable *obj,function<int_(QPDFObjectHandle_&)> *skip_stream_parameters)

{
  function<int_(QPDFObjectHandle_&)> local_40;
  function<int_(QPDFObjectHandle_&)> *local_20;
  function<int_(QPDFObjectHandle_&)> *skip_stream_parameters_local;
  ObjTable *obj_local;
  QPDF *qpdf_local;
  
  local_20 = skip_stream_parameters;
  skip_stream_parameters_local = (function<int_(QPDFObjectHandle_&)> *)obj;
  obj_local = (ObjTable *)qpdf;
  std::function<int_(QPDFObjectHandle_&)>::function(&local_40,skip_stream_parameters);
  QPDF::optimize(qpdf,obj,&local_40);
  std::function<int_(QPDFObjectHandle_&)>::~function(&local_40);
  return;
}

Assistant:

static void
    optimize(
        QPDF& qpdf,
        QPDFWriter::ObjTable const& obj,
        std::function<int(QPDFObjectHandle&)> skip_stream_parameters)
    {
        qpdf.optimize(obj, skip_stream_parameters);
    }